

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# migrate.cpp
# Opt level: O2

unique_ptr<wallet::BerkeleyRODatabase,_std::default_delete<wallet::BerkeleyRODatabase>_>
wallet::MakeBerkeleyRODatabase
          (path *path,DatabaseOptions *options,DatabaseStatus *status,bilingual_str *error)

{
  long in_FS_OFFSET;
  path data_file;
  path local_50;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  BDBDataFile((path *)&local_50,(path *)options);
  std::make_unique<wallet::BerkeleyRODatabase,fs::path&>(path);
  *(undefined4 *)&(error->original)._M_dataplus._M_p = 0;
  std::filesystem::__cxx11::path::~path(&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (__uniq_ptr_data<wallet::BerkeleyRODatabase,_std::default_delete<wallet::BerkeleyRODatabase>,_true,_true>
            )(__uniq_ptr_data<wallet::BerkeleyRODatabase,_std::default_delete<wallet::BerkeleyRODatabase>,_true,_true>
              )path;
  }
  __stack_chk_fail();
}

Assistant:

std::unique_ptr<BerkeleyRODatabase> MakeBerkeleyRODatabase(const fs::path& path, const DatabaseOptions& options, DatabaseStatus& status, bilingual_str& error)
{
    fs::path data_file = BDBDataFile(path);
    try {
        std::unique_ptr<BerkeleyRODatabase> db = std::make_unique<BerkeleyRODatabase>(data_file);
        status = DatabaseStatus::SUCCESS;
        return db;
    } catch (const std::runtime_error& e) {
        error.original = e.what();
        status = DatabaseStatus::FAILED_LOAD;
        return nullptr;
    }
}